

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O2

void file_archive(char *fname,char *append)

{
  char *pcVar1;
  _Bool _Var2;
  char *pcVar3;
  uint uVar4;
  char arch [1024];
  char old [1024];
  
  pcVar1 = ANGBAND_DIR_ARCHIVE;
  if (append == (char *)0x0) {
    for (uVar4 = 1; pcVar1 = ANGBAND_DIR_ARCHIVE, uVar4 != 10000; uVar4 = uVar4 + 1) {
      pcVar3 = archive_user_pfx;
      if (archive_user_pfx == (char *)0x0) {
        pcVar3 = "";
      }
      pcVar3 = format("%s%s_%d.txt",pcVar3,fname,(ulong)uVar4);
      path_build(arch,0x400,pcVar1,pcVar3);
      _Var2 = file_exists(arch);
      if (!_Var2) break;
      my_strcpy(arch,"",0x400);
    }
  }
  else {
    pcVar3 = "";
    if (archive_user_pfx != (char *)0x0) {
      pcVar3 = archive_user_pfx;
    }
    pcVar3 = format("%s%s_%s.txt",pcVar3,fname,append);
    path_build(arch,0x400,pcVar1,pcVar3);
  }
  pcVar1 = ANGBAND_DIR_USER;
  pcVar3 = format("%s.txt",fname);
  path_build(old,0x400,pcVar1,pcVar3);
  safe_setuid_grab();
  file_move(old,arch);
  safe_setuid_drop();
  return;
}

Assistant:

void file_archive(const char *fname, const char *append)
{
	char arch[1024];
	char old[1024];
	int i, max_arch = 10000;

	/* Add a suffix to the filename, custom if requested */
	if (append) {
		path_build(arch, sizeof(arch), ANGBAND_DIR_ARCHIVE,
			format("%s%s_%s.txt",
			(archive_user_pfx) ? archive_user_pfx : "", fname,
			append));
	} else {
		/* Check the indices of existing archived files, get the next one */
		for (i = 1; i < max_arch; i++) {
			path_build(arch, sizeof(arch), ANGBAND_DIR_ARCHIVE,
				format("%s%s_%d.txt",
				(archive_user_pfx) ? archive_user_pfx : "",
				fname, i));
			if (!file_exists(arch)) break;
			my_strcpy(arch, "", sizeof(arch));
		} 
	}

	/* Move the file */
	path_build(old, sizeof(old), ANGBAND_DIR_USER, format("%s.txt", fname));
	safe_setuid_grab();
	file_move(old, arch);
	safe_setuid_drop();
}